

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O0

void __thiscall
particle_decay::perform_three_body_decay
          (particle_decay *this,particle_info *mother,particle_info *daughter1,
          particle_info *daughter2,particle_info *daughter3)

{
  particle_info part;
  ostream *poVar1;
  void *pvVar2;
  double dVar3;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_R8;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double vp3;
  double vp2;
  double vp1;
  double gamma_m_1;
  double gamma;
  double v2;
  double vz;
  double vy;
  double vx;
  double p3_lrf_z;
  double p3_lrf_y;
  double p3_lrf_x;
  double p2_lrf_z;
  double p2_lrf_y;
  double p2_lrf_x;
  double p1_lrf_z;
  double p1_lrf_y;
  double p1_lrf_x;
  double sin_theta;
  double cos_ksi;
  double sin_ksi;
  double cos_phi;
  double sin_phi;
  double cos_theta;
  double ksi;
  double phi;
  double tp3_lrf_z;
  double tp3_lrf_x;
  double tp2_lrf_z;
  double tp2_lrf_x;
  double decay_z;
  double decay_y;
  double decay_x;
  double decay_time;
  double tau;
  double life_time;
  double E3_lrf_1;
  double cos12_lrf;
  double p2_lrf;
  double p1_lrf;
  double E3_lrf;
  double E2_lrf;
  double E1_lrf;
  double M_sampled;
  double M_min;
  double m3;
  double m2;
  double m1;
  double M_width;
  double M_pole;
  Random *this_00;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  double in_stack_fffffffffffffdb0;
  bool local_241;
  double local_118;
  undefined1 local_b0 [8];
  Random *pRStack_a8;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  
  local_30 = *(double *)(in_RSI + 2);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memcpy(local_b0,in_RSI,0x78);
  part.mass = (double)local_90;
  part._0_8_ = uStack_98;
  part._16_8_ = uStack_88;
  part.px = (double)local_80;
  part.py = (double)uStack_78;
  part.pz = (double)local_70;
  part.E = (double)uStack_68;
  part.x = (double)local_60;
  part.y = (double)uStack_58;
  part.z = (double)local_50;
  part.t = (double)uStack_48;
  part.rap_y = (double)local_40;
  part.rap_eta = (double)in_stack_fffffffffffffda0;
  part.pT = (double)in_stack_fffffffffffffda8;
  part.phi_p = in_stack_fffffffffffffdb0;
  local_38 = get_particle_width((particle_decay *)pRStack_a8,part);
  dVar3 = local_30;
  dVar20 = *(double *)(local_18 + 2);
  dVar23 = *(double *)(local_20 + 2);
  dVar24 = *(double *)(local_28 + 2);
  this_00 = pRStack_a8;
  if (local_30 < dVar20 + dVar23 + dVar24) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Error:particleSamples::perform_three_body_decay:");
    poVar1 = std::operator<<(poVar1,"can not found decays!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"M = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
    poVar1 = std::operator<<(poVar1,", m1 = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar20);
    poVar1 = std::operator<<(poVar1,", m2 = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar23);
    poVar1 = std::operator<<(poVar1,", m3 = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar24);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"reso: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_10);
    poVar1 = std::operator<<(poVar1,", m1: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_18);
    poVar1 = std::operator<<(poVar1,", m2: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_20);
    poVar1 = std::operator<<(poVar1,", m3: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*local_28);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  do {
    do {
      std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x18432b);
      dVar4 = RandomUtil::Random::rand_uniform(this_00);
      dVar4 = dVar4 * (((dVar3 - dVar20) - dVar23) - dVar24) + dVar20;
      std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x184382);
      dVar5 = RandomUtil::Random::rand_uniform(this_00);
      dVar5 = dVar5 * (((dVar3 - dVar20) - dVar23) - dVar24) + dVar23;
    } while (dVar3 < dVar4 + dVar5);
    dVar6 = sqrt(dVar4 * dVar4 + -(dVar20 * dVar20));
    dVar7 = sqrt(dVar5 * dVar5 + -(dVar23 * dVar23));
    dVar5 = (dVar3 - dVar4) - dVar5;
    dVar4 = (-dVar24 * dVar24 + -dVar7 * dVar7 + dVar5 * dVar5 + -(dVar6 * dVar6)) /
            (dVar6 * 2.0 * dVar7);
    local_241 = dVar4 < -1.0 || 1.0 < dVar4;
  } while (local_241);
  local_118 = 10000000000.0;
  if (1e-10 < local_38) {
    dVar3 = -(((*(double *)(local_10 + 0xc) / dVar3) * 1.0) / local_38);
    std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18465f);
    dVar5 = RandomUtil::Random::rand_uniform(this_00);
    dVar5 = log(dVar5);
    local_118 = dVar3 * dVar5 * 0.19733;
  }
  dVar8 = *(double *)(local_10 + 0x14) + local_118;
  dVar9 = (*(double *)(local_10 + 6) / *(double *)(local_10 + 0xc)) * local_118 +
          *(double *)(local_10 + 0xe);
  dVar10 = (*(double *)(local_10 + 8) / *(double *)(local_10 + 0xc)) * local_118 +
           *(double *)(local_10 + 0x10);
  dVar11 = (*(double *)(local_10 + 10) / *(double *)(local_10 + 0xc)) * local_118 +
           *(double *)(local_10 + 0x12);
  dVar3 = dVar7;
  dVar5 = sqrt(-dVar4 * dVar4 + 1.0);
  dVar3 = dVar3 * dVar5;
  dVar7 = dVar7 * dVar4;
  dVar4 = -dVar3;
  dVar5 = -(dVar6 + dVar7);
  std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x184871);
  dVar12 = RandomUtil::Random::rand_uniform(this_00);
  std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1848a2);
  dVar13 = RandomUtil::Random::rand_uniform(this_00);
  std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1848d3);
  dVar14 = RandomUtil::Random::rand_uniform(this_00);
  dVar14 = dVar14 + dVar14 + -1.0;
  dVar15 = sin(dVar12 * 6.283185307179586);
  dVar12 = cos(dVar12 * 6.283185307179586);
  dVar16 = sin(dVar13 * 6.283185307179586);
  dVar13 = cos(dVar13 * 6.283185307179586);
  dVar17 = sqrt(-dVar14 * dVar14 + 1.0);
  dVar18 = -dVar6 * dVar17 * dVar13;
  dVar19 = dVar6 * dVar17 * dVar16;
  dVar6 = dVar6 * dVar14;
  dVar20 = sqrt(dVar6 * dVar6 + dVar19 * dVar19 + dVar20 * dVar20 + dVar18 * dVar18);
  dVar21 = dVar3 * (dVar12 * dVar14 * dVar13 + -(dVar15 * dVar16)) + -(dVar7 * dVar17 * dVar13);
  dVar22 = dVar3 * (-dVar12 * dVar14 * dVar16 + -(dVar15 * dVar13)) + dVar7 * dVar17 * dVar16;
  dVar3 = dVar3 * dVar12 * dVar17 + dVar7 * dVar14;
  dVar23 = sqrt(dVar3 * dVar3 + dVar22 * dVar22 + dVar23 * dVar23 + dVar21 * dVar21);
  dVar7 = dVar4 * (dVar12 * dVar14 * dVar13 + -(dVar15 * dVar16)) + -(dVar5 * dVar17 * dVar13);
  dVar13 = dVar4 * (-dVar12 * dVar14 * dVar16 + -(dVar15 * dVar13)) + dVar5 * dVar17 * dVar16;
  dVar4 = dVar4 * dVar12 * dVar17 + dVar5 * dVar14;
  dVar24 = sqrt(dVar4 * dVar4 + dVar13 * dVar13 + dVar24 * dVar24 + dVar7 * dVar7);
  dVar5 = *(double *)(local_10 + 6) / *(double *)(local_10 + 0xc);
  dVar12 = *(double *)(local_10 + 8) / *(double *)(local_10 + 0xc);
  dVar14 = *(double *)(local_10 + 10) / *(double *)(local_10 + 0xc);
  dVar15 = dVar14 * dVar14 + dVar5 * dVar5 + dVar12 * dVar12;
  dVar16 = sqrt(1.0 - dVar15);
  dVar16 = 1.0 / dVar16;
  dVar17 = dVar16 - 1.0;
  dVar25 = dVar14 * dVar6 + dVar5 * dVar18 + dVar12 * dVar19;
  dVar26 = dVar14 * dVar3 + dVar5 * dVar21 + dVar12 * dVar22;
  dVar27 = dVar14 * dVar4 + dVar5 * dVar7 + dVar12 * dVar13;
  *(double *)(local_18 + 0xc) = dVar16 * (dVar20 + dVar25);
  *(double *)(local_18 + 6) = (dVar16 * dVar20 + (dVar17 * dVar25) / dVar15) * dVar5 + dVar18;
  *(double *)(local_18 + 8) = (dVar16 * dVar20 + (dVar17 * dVar25) / dVar15) * dVar12 + dVar19;
  *(double *)(local_18 + 10) = (dVar16 * dVar20 + (dVar17 * dVar25) / dVar15) * dVar14 + dVar6;
  *(double *)(local_18 + 0x14) = dVar8;
  *(double *)(local_18 + 0xe) = dVar9;
  *(double *)(local_18 + 0x10) = dVar10;
  *(double *)(local_18 + 0x12) = dVar11;
  *(double *)(local_20 + 0xc) = dVar16 * (dVar23 + dVar26);
  *(double *)(local_20 + 6) = (dVar16 * dVar23 + (dVar17 * dVar26) / dVar15) * dVar5 + dVar21;
  *(double *)(local_20 + 8) = (dVar16 * dVar23 + (dVar17 * dVar26) / dVar15) * dVar12 + dVar22;
  *(double *)(local_20 + 10) = (dVar16 * dVar23 + (dVar17 * dVar26) / dVar15) * dVar14 + dVar3;
  *(double *)(local_20 + 0x14) = dVar8;
  *(double *)(local_20 + 0xe) = dVar9;
  *(double *)(local_20 + 0x10) = dVar10;
  *(double *)(local_20 + 0x12) = dVar11;
  *(double *)(local_28 + 0xc) = dVar16 * (dVar24 + dVar27);
  *(double *)(local_28 + 6) = (dVar16 * dVar24 + (dVar17 * dVar27) / dVar15) * dVar5 + dVar7;
  *(double *)(local_28 + 8) = (dVar16 * dVar24 + (dVar17 * dVar27) / dVar15) * dVar12 + dVar13;
  *(double *)(local_28 + 10) = (dVar16 * dVar24 + (dVar17 * dVar27) / dVar15) * dVar14 + dVar4;
  *(double *)(local_28 + 0x14) = dVar8;
  *(double *)(local_28 + 0xe) = dVar9;
  *(double *)(local_28 + 0x10) = dVar10;
  *(double *)(local_28 + 0x12) = dVar11;
  return;
}

Assistant:

void particle_decay::perform_three_body_decay(
    particle_info &mother, particle_info &daughter1, particle_info &daughter2,
    particle_info &daughter3) {
    double M_pole = mother.mass;
    double M_width = get_particle_width(mother);
    double m1 = daughter1.mass;
    double m2 = daughter2.mass;
    double m3 = daughter3.mass;
    double M_min = m1 + m2 + m3;
    if (M_pole < M_min) {
        cout << "Error:particleSamples::perform_three_body_decay:"
             << "can not found decays!" << endl;
        cout << "M = " << M_pole << ", m1 = " << m1 << ", m2 = " << m2
             << ", m3 = " << m3 << endl;
        cout << "reso: " << mother.monval << ", m1: " << daughter1.monval
             << ", m2: " << daughter2.monval << ", m3: " << daughter3.monval
             << endl;
        exit(1);
    }
    // double M_sampled = sample_breit_wigner(M_pole, M_width, M_min);
    double M_sampled = M_pole;
    // generate lrf E1, E2, and theta12 using accept and reject method
    double E1_lrf, E2_lrf, E3_lrf, p1_lrf, p2_lrf, cos12_lrf;
    do {
        do {
            E1_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m1;
            E2_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m2;
        } while (E1_lrf + E2_lrf > M_sampled);
        p1_lrf = sqrt(E1_lrf * E1_lrf - m1 * m1);
        p2_lrf = sqrt(E2_lrf * E2_lrf - m2 * m2);
        double E3_lrf = M_sampled - E1_lrf - E2_lrf;
        cos12_lrf =
            (E3_lrf * E3_lrf - p1_lrf * p1_lrf - p2_lrf * p2_lrf - m3 * m3)
            / (2. * p1_lrf * p2_lrf);
    } while (cos12_lrf < -1.0 || cos12_lrf > 1.0);
    // now we get the a good sample

    // sample the lifetime
    double life_time = 1e10;
    if (M_width > 1e-10) {
        double tau = mother.E / (M_sampled) * 1. / M_width;
        life_time = -tau * log(ran_gen_ptr_->rand_uniform());
        life_time *= AfterburnerUtil::hbarc;  // convert unit to fm
    }
    // compute the decay position
    double decay_time = mother.t + life_time;
    double decay_x = mother.x + mother.px / mother.E * life_time;
    double decay_y = mother.y + mother.py / mother.E * life_time;
    double decay_z = mother.z + mother.pz / mother.E * life_time;

    // compute the momentum of decay daughters
    double tp2_lrf_x = p2_lrf * sqrt(1. - cos12_lrf * cos12_lrf);
    double tp2_lrf_z = p2_lrf * cos12_lrf;
    double tp3_lrf_x = -tp2_lrf_x;
    double tp3_lrf_z = -(p1_lrf + tp2_lrf_z);
    double phi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double ksi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double cos_theta = 2. * ran_gen_ptr_->rand_uniform() - 1.0;

    double sin_phi = sin(phi);
    double cos_phi = cos(phi);
    double sin_ksi = sin(ksi);
    double cos_ksi = cos(ksi);
    double sin_theta = sqrt(1. - cos_theta * cos_theta);

    double p1_lrf_x = -p1_lrf * sin_theta * cos_ksi;
    double p1_lrf_y = p1_lrf * sin_theta * sin_ksi;
    double p1_lrf_z = p1_lrf * cos_theta;
    E1_lrf = sqrt(
        m1 * m1 + p1_lrf_x * p1_lrf_x + p1_lrf_y * p1_lrf_y
        + p1_lrf_z * p1_lrf_z);
    double p2_lrf_x =
        (tp2_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp2_lrf_z * sin_theta * cos_ksi);
    double p2_lrf_y =
        (tp2_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp2_lrf_z * sin_theta * sin_ksi);
    double p2_lrf_z = tp2_lrf_x * (cos_phi * sin_theta) + tp2_lrf_z * cos_theta;
    E2_lrf = sqrt(
        m2 * m2 + p2_lrf_x * p2_lrf_x + p2_lrf_y * p2_lrf_y
        + p2_lrf_z * p2_lrf_z);
    double p3_lrf_x =
        (tp3_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp3_lrf_z * sin_theta * cos_ksi);
    double p3_lrf_y =
        (tp3_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp3_lrf_z * (sin_theta * sin_ksi));
    double p3_lrf_z = tp3_lrf_x * cos_phi * sin_theta + tp3_lrf_z * cos_theta;
    E3_lrf = sqrt(
        m3 * m3 + p3_lrf_x * p3_lrf_x + p3_lrf_y * p3_lrf_y
        + p3_lrf_z * p3_lrf_z);

    double vx = mother.px / mother.E;
    double vy = mother.py / mother.E;
    double vz = mother.pz / mother.E;
    double v2 = vx * vx + vy * vy + vz * vz;
    double gamma = 1. / sqrt(1. - v2);
    double gamma_m_1 = gamma - 1.;
    double vp1 = vx * p1_lrf_x + vy * p1_lrf_y + vz * p1_lrf_z;
    double vp2 = vx * p2_lrf_x + vy * p2_lrf_y + vz * p2_lrf_z;
    double vp3 = vx * p3_lrf_x + vy * p3_lrf_y + vz * p3_lrf_z;

    daughter1.E = gamma * (E1_lrf + vp1);
    daughter1.px = p1_lrf_x + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vx;
    daughter1.py = p1_lrf_y + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vy;
    daughter1.pz = p1_lrf_z + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vz;
    daughter1.t = decay_time;
    daughter1.x = decay_x;
    daughter1.y = decay_y;
    daughter1.z = decay_z;

    daughter2.E = gamma * (E2_lrf + vp2);
    daughter2.px = p2_lrf_x + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vx;
    daughter2.py = p2_lrf_y + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vy;
    daughter2.pz = p2_lrf_z + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vz;
    daughter2.t = decay_time;
    daughter2.x = decay_x;
    daughter2.y = decay_y;
    daughter2.z = decay_z;

    daughter3.E = gamma * (E3_lrf + vp3);
    daughter3.px = p3_lrf_x + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vx;
    daughter3.py = p3_lrf_y + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vy;
    daughter3.pz = p3_lrf_z + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vz;
    daughter3.t = decay_time;
    daughter3.x = decay_x;
    daughter3.y = decay_y;
    daughter3.z = decay_z;
}